

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

int64_t __thiscall libtorrent::bdecode_node::int_value(bdecode_node *this)

{
  char *end;
  error_code_enum ec;
  bool negative;
  int64_t val;
  char *ptr;
  bdecode_token *pbStack_20;
  int size;
  bdecode_token *t;
  bdecode_node *this_local;
  
  pbStack_20 = this->m_root_tokens + this->m_token_idx;
  t = (bdecode_token *)this;
  ptr._4_4_ = anon_unknown_10::token_source_span(pbStack_20);
  val = (int64_t)(this->m_buffer + (long)(int)(SUB84(*pbStack_20,0) & 0x1fffffff) + 1);
  _ec = (bdecode_node *)0x0;
  end._7_1_ = *(char *)val == '-';
  end._0_4_ = 0;
  parse_int((char *)(val + (int)(uint)end._7_1_),(char *)(val + ptr._4_4_),'e',(int64_t *)&ec,
            (error_code_enum *)&end);
  if ((int)end == 0) {
    if ((end._7_1_ & 1) != 0) {
      _ec = (bdecode_node *)-(long)_ec;
    }
    this_local = _ec;
  }
  else {
    this_local = (bdecode_node *)0x0;
  }
  return (int64_t)this_local;
}

Assistant:

std::int64_t bdecode_node::int_value() const
	{
		TORRENT_ASSERT(type() == int_t);
		bdecode_token const& t = m_root_tokens[m_token_idx];
		int const size = token_source_span(t);
		TORRENT_ASSERT(t.type == bdecode_token::integer);

		// +1 is to skip the 'i'
		char const* ptr = m_buffer + t.offset + 1;
		std::int64_t val = 0;
		bool const negative = (*ptr == '-');
		bdecode_errors::error_code_enum ec = bdecode_errors::no_error;
		char const* end = parse_int(ptr + int(negative)
			, ptr + size, 'e', val, ec);
		if (ec) return 0;
		TORRENT_UNUSED(end);
		TORRENT_ASSERT(end < ptr + size);
		if (negative) val = -val;
		return val;
	}